

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O1

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaicCube(void)

{
  int iVar1;
  pointer pVVar2;
  int quadNdx;
  long lVar3;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *in_RDI;
  int vertexNdx;
  long lVar4;
  long lVar5;
  int local_30 [6];
  
  if (createQuadMosaicCube()::texCoordsCube == '\0') {
    createQuadMosaicCube();
  }
  createQuadMosaic(in_RDI,2,3);
  pVVar2 = (in_RDI->
           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      iVar1 = createQuadMosaicCube::texCoordCubeIndices[lVar3][lVar4];
      local_30[2] = 0;
      local_30[3] = 1;
      local_30[4] = 2;
      lVar5 = 2;
      do {
        (pVVar2->texCoord).m_data[local_30[lVar5]] =
             *(float *)((long)iVar1 * 0xc + 0xd4e688 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      pVVar2 = pVVar2 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return in_RDI;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaicCube (void)
{
	using tcu::Vec3;

	static const Vec3 texCoordsCube[8] =
	{
		Vec3(-1.0f, -1.0f, -1.0f),	// 0: -X, -Y, -Z
		Vec3(1.0f, -1.0f, -1.0f),	// 1:  X, -Y, -Z
		Vec3(1.0f, -1.0f, 1.0f),	// 2:  X, -Y,  Z
		Vec3(-1.0f, -1.0f, 1.0f),	// 3: -X, -Y,  Z

		Vec3(-1.0f, 1.0f, -1.0f),	// 4: -X,  Y, -Z
		Vec3(1.0f, 1.0f, -1.0f),	// 5:  X,  Y, -Z
		Vec3(1.0f, 1.0f, 1.0f),		// 6:  X,  Y,  Z
		Vec3(-1.0f, 1.0f, 1.0f),	// 7: -X,  Y,  Z
	};

	static const int texCoordCubeIndices[6][6] =
	{
		{ 6, 5, 2, 2, 5, 1 },		// +X face
		{ 3, 0, 7, 7, 0, 4 },		// -X face
		{ 4, 5, 7, 7, 5, 6 },		// +Y face
		{ 3, 2, 0, 0, 2, 1 },		// -Y face
		{ 2, 3, 6, 6, 3, 7 },		// +Z face
		{ 0, 1, 4, 4, 1, 5 }		// -Z face
	};

	// Create 6 quads and set appropriate texture coordinates for cube mapping

	std::vector<Vertex4Tex4>			vertices	= createQuadMosaic(2, 3);
	std::vector<Vertex4Tex4>::iterator	vertexItr	= vertices.begin();

	for (int quadNdx = 0; quadNdx < 6; quadNdx++)
	{
		for (int vertexNdx = 0; vertexNdx < 6; vertexNdx++)
		{
			vertexItr->texCoord.xyz() = texCoordsCube[texCoordCubeIndices[quadNdx][vertexNdx]];
			vertexItr++;
		}
	}

	return vertices;
}